

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void hash_element_dtor(void *user,void *element)

{
  curl_hash_element *e;
  curl_hash *h;
  void *element_local;
  void *user_local;
  
  (*Curl_cfree)(*(void **)((long)element + 8));
  *(undefined8 *)((long)element + 8) = 0;
  if (*element != 0) {
    (**(code **)((long)user + 0x18))(*element);
    *(undefined8 *)element = 0;
  }
  *(undefined8 *)((long)element + 0x10) = 0;
  (*Curl_cfree)(element);
  return;
}

Assistant:

static void
hash_element_dtor(void *user, void *element)
{
  struct curl_hash *h = (struct curl_hash *) user;
  struct curl_hash_element *e = (struct curl_hash_element *) element;

  Curl_safefree(e->key);

  if(e->ptr) {
    h->dtor(e->ptr);
    e->ptr = NULL;
  }

  e->key_len = 0;

  free(e);
}